

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void showMemInfo(void)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  iterator __end1;
  ostream *poVar4;
  list<MemBlock_*,_std::allocator<MemBlock_*>_> *plVar5;
  list<Process_*,_std::allocator<Process_*>_> *plVar6;
  int iVar7;
  iterator __end1_2;
  int iVar8;
  iterator __end1_1;
  
  printSplitLine();
  iVar7 = 0;
  plVar5 = &freeMemBlockList_abi_cxx11_;
  while (plVar5 = (list<MemBlock_*,_std::allocator<MemBlock_*>_> *)
                  (plVar5->super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>)._M_impl.
                  _M_node.super__List_node_base._M_next, plVar5 != &freeMemBlockList_abi_cxx11_) {
    iVar7 = iVar7 + *(int *)(*(long *)((long)plVar5 + 0x10) + 4);
  }
  iVar8 = 0;
  plVar5 = &usedMemBlockList_abi_cxx11_;
  while (plVar5 = (list<MemBlock_*,_std::allocator<MemBlock_*>_> *)
                  (plVar5->super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>)._M_impl.
                  _M_node.super__List_node_base._M_next, plVar5 != &usedMemBlockList_abi_cxx11_) {
    iVar8 = iVar8 + *(int *)(*(long *)((long)plVar5 + 0x10) + 4);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"main mem info:");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"\ttotal: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,memSize);
  poVar4 = std::operator<<(poVar4,"\t\tused: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar8);
  poVar4 = std::operator<<(poVar4,"\t\tfree: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar7);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar4 = std::operator<<((ostream *)&std::cout,"used mem info:");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"\tfrom\tto  \tsize\townerProcess");
  plVar6 = &processList_abi_cxx11_;
  while( true ) {
    std::endl<char,std::char_traits<char>>(poVar4);
    plVar6 = (list<Process_*,_std::allocator<Process_*>_> *)
             (plVar6->super__List_base<Process_*,_std::allocator<Process_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if (plVar6 == &processList_abi_cxx11_) break;
    piVar1 = *(int **)((long)plVar6 + 0x10);
    piVar2 = *(int **)(piVar1 + 0xe);
    poVar4 = std::operator<<((ostream *)&std::cout,"\t");
    lVar3 = *(long *)poVar4;
    *(uint *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x18) | 0x20;
    *(undefined8 *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x10) = 7;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar2);
    poVar4 = std::operator<<(poVar4," ");
    lVar3 = *(long *)poVar4;
    *(uint *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x18) | 0x20;
    *(undefined8 *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x10) = 7;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar2 + piVar2[1] + -1);
    poVar4 = std::operator<<(poVar4," ");
    lVar3 = *(long *)poVar4;
    *(uint *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x18) | 0x20;
    *(undefined8 *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x10) = 7;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,piVar2[1]);
    poVar4 = std::operator<<(poVar4," ");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) | 0x20;
    poVar4 = std::operator<<(poVar4,(char *)(piVar1 + 1));
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar1);
    poVar4 = std::operator<<(poVar4,")");
  }
  if (processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>._M_impl._M_node
      ._M_size == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"\t");
    poVar4 = std::operator<<(poVar4,"none");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar4 = std::operator<<((ostream *)&std::cout,"free mem info:");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"\tfrom\tto  \tsize");
  plVar5 = &freeMemBlockList_abi_cxx11_;
  while( true ) {
    std::endl<char,std::char_traits<char>>(poVar4);
    plVar5 = (list<MemBlock_*,_std::allocator<MemBlock_*>_> *)
             (plVar5->super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if (plVar5 == &freeMemBlockList_abi_cxx11_) break;
    piVar1 = *(int **)((long)plVar5 + 0x10);
    poVar4 = std::operator<<((ostream *)&std::cout,"\t");
    lVar3 = *(long *)poVar4;
    *(uint *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x18) | 0x20;
    *(undefined8 *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x10) = 7;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar1);
    poVar4 = std::operator<<(poVar4," ");
    lVar3 = *(long *)poVar4;
    *(uint *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x18) | 0x20;
    *(undefined8 *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x10) = 7;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar1 + piVar1[1] + -1);
    poVar4 = std::operator<<(poVar4," ");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) | 0x20;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,piVar1[1]);
  }
  if (freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
      _M_node._M_size == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"\t");
    poVar4 = std::operator<<(poVar4,"none");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  printSplitLine();
  return;
}

Assistant:

void showMemInfo() {
    printSplitLine();
    // 先输出概况
    int allFreeSize = 0, allUsedSize = 0;
    for (MemBlock *i : freeMemBlockList) allFreeSize += i->length;
    for (MemBlock *i : usedMemBlockList) allUsedSize += i->length;
    cout << "main mem info:" << endl;
    cout << "\ttotal: " << memSize
         << "\t\tused: " << allUsedSize
         << "\t\tfree: " << allFreeSize
         << endl;
    cout << endl;
    cout << "used mem info:" << endl;
    cout << "\tfrom\tto  \tsize\townerProcess" << endl;
    // 输出已经被使用的内存块情况
    for (Process *i : processList) {
        MemBlock *used = i->memBlock;
        cout << "\t" << setiosflags(ios::left) << setw(7) << used->start
             << " " << setiosflags(ios::left) << setw(7) << used->start + used->length - 1
             << " " << setiosflags(ios::left) << setw(7) << used->length
             << " " << setiosflags(ios::left) << i->name << "(" << i->pid << ")"
             << endl;
    }
    if (processList.size() == 0) cout << "\t" << "none" << endl;
    cout << endl;
    // 输出空闲内存块情况
    cout << "free mem info:" << endl;
    cout << "\tfrom\tto  \tsize" << endl;
    for (MemBlock *i : freeMemBlockList)
        cout << "\t" << setiosflags(ios::left) << setw(7) << i->start
             << " " << setiosflags(ios::left) << setw(7) << i->start + i->length - 1
             << " " << setiosflags(ios::left) << i->length
             << endl;
    if (freeMemBlockList.size() == 0) cout << "\t" << "none" << endl;
    printSplitLine();
}